

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::prepareCommandBuffer
          (GraphicsCacheTestInstance *this)

{
  VkFramebuffer VVar1;
  VkResult VVar2;
  VkCommandBufferInheritanceInfo *pVVar3;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)23> *pHVar5;
  Handle<(vk::HandleType)18> *pHVar6;
  undefined8 local_38;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  DeviceInterface *vk;
  GraphicsCacheTestInstance *this_local;
  
  pVVar3 = (VkCommandBufferInheritanceInfo *)
           Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  local_38 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = pVVar3;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_CacheTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar2 = (*(*(_func_int ***)pVVar3)[0x49])(pVVar3,*ppVVar4,&local_38);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x45a);
  pVVar3 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_CacheTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (**(code **)(*(long *)pVVar3 + 0x368))
            (pVVar3,*ppVVar4,1,0x80,0,0,0,0,0,3,this->m_imageLayoutBarriers);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  VVar1.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  prepareRenderPass(this,VVar1,(VkPipeline)pHVar6->m_internal);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  VVar1.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  prepareRenderPass(this,VVar1,(VkPipeline)pHVar6->m_internal);
  pVVar3 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_CacheTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar2 = (**(code **)(*(long *)pVVar3 + 0x250))(pVVar3,*ppVVar4);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x465);
  return;
}

Assistant:

void GraphicsCacheTestInstance::prepareCommandBuffer (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, (VkDependencyFlags)0,
		0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(m_imageLayoutBarriers), m_imageLayoutBarriers);

	prepareRenderPass(*m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE], *m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]);

	// After the first render pass, the images are in correct layouts

	prepareRenderPass(*m_framebuffer[PIPELINE_CACHE_NDX_CACHED], *m_pipeline[PIPELINE_CACHE_NDX_CACHED]);

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}